

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::IterVar::has_iter_var(Var *var)

{
  bool bVar1;
  VarType VVar2;
  int iVar3;
  undefined4 extraout_var;
  bool local_29;
  Expr *expr;
  VarSlice *slice;
  Var *var_local;
  
  if (var == (Var *)0x0) {
    var_local._7_1_ = false;
  }
  else {
    VVar2 = Var::type(var);
    if (VVar2 == Iter) {
      var_local._7_1_ = true;
    }
    else {
      VVar2 = Var::type(var);
      if (VVar2 == Slice) {
        iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x28])();
        var_local._7_1_ = has_iter_var((Var *)CONCAT44(extraout_var,iVar3));
      }
      else {
        VVar2 = Var::type(var);
        if (VVar2 == Expression) {
          bVar1 = has_iter_var((Var *)var[1].super_IRNode.fn_name_ln.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          local_29 = true;
          if (!bVar1) {
            local_29 = has_iter_var((Var *)var[1].super_IRNode.fn_name_ln.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
          }
          var_local._7_1_ = local_29;
        }
        else {
          var_local._7_1_ = false;
        }
      }
    }
  }
  return var_local._7_1_;
}

Assistant:

bool IterVar::has_iter_var(const Var *var) {
    if (!var) return false;
    if (var->type() == VarType::Iter) return true;
    if (var->type() == VarType::Slice) {
        auto const *slice = reinterpret_cast<const VarSlice *>(var);
        return has_iter_var(slice->get_var_root_parent());
    } else if (var->type() == VarType::Expression) {
        auto const *expr = reinterpret_cast<const Expr *>(var);
        return has_iter_var(expr->left) || has_iter_var(expr->right);
    }
    return false;
}